

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O1

int fits_set_compression_pref(fitsfile *infptr,fitsfile *outfptr,int *status)

{
  FITSfile *pFVar1;
  bool bVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int ii;
  char *pcVar8;
  float fVar9;
  int nkeys;
  int naxis;
  char card [81];
  LONGLONG dataend;
  LONGLONG datastart;
  char value [71];
  int local_12c;
  long local_128 [7];
  int local_ec;
  short local_e8;
  undefined4 local_e6;
  short local_e2;
  long local_88;
  long local_80;
  char local_78 [72];
  
  local_128[0] = 1;
  local_128[1] = 1;
  local_128[2] = 1;
  local_128[3] = 1;
  local_128[4] = 1;
  local_128[5] = 1;
  iVar6 = *status;
  if (iVar6 < 1) {
    ffghadll(infptr,(LONGLONG *)0x0,&local_80,&local_88,status);
    if (0xffffffff < local_88 - local_80) {
      outfptr->Fptr->request_huge_hdu = 1;
    }
    ffghsp(infptr,&local_12c,(int *)0x0,status);
    if (1 < local_12c) {
      iVar6 = 2;
      do {
        ffgrec(infptr,iVar6,(char *)&local_e8,status);
        if (local_e8 == 0x5a46) {
          ffpsvc((char *)&local_e8,local_78,(char *)0x0,status);
          if ((char)local_e2 == 'R' && local_e6 == 0x4f474c41) {
            iVar5 = fits_strncasecmp(local_78,"\'RICE_1",7);
            if (iVar5 == 0) {
              iVar5 = 0xb;
            }
            else {
              iVar5 = fits_strncasecmp(local_78,"\'GZIP_1",7);
              if (iVar5 == 0) {
                iVar5 = 0x15;
              }
              else {
                iVar5 = fits_strncasecmp(local_78,"\'GZIP_2",7);
                if (iVar5 == 0) {
                  iVar5 = 0x16;
                }
                else {
                  iVar5 = fits_strncasecmp(local_78,"\'PLIO_1",7);
                  if (iVar5 == 0) {
                    iVar5 = 0x1f;
                  }
                  else {
                    iVar5 = fits_strncasecmp(local_78,"\'HCOMPRESS_1",0xc);
                    if (iVar5 == 0) {
                      iVar5 = 0x29;
                    }
                    else {
                      iVar4 = fits_strncasecmp(local_78,"\'NONE",5);
                      iVar5 = -1;
                      if (iVar4 != 0) {
                        pcVar8 = "Unknown FZALGOR keyword compression algorithm:";
                        goto LAB_001c5fea;
                      }
                    }
                  }
                }
              }
            }
            if ((iVar5 + 1U < 0x35) &&
               ((0x10040100c01003U >> ((ulong)(iVar5 + 1U) & 0x3f) & 1) != 0)) {
              outfptr->Fptr->request_compress_type = iVar5;
            }
            else {
              pcVar8 = "unknown compression algorithm (fits_set_compression_type)";
LAB_001c5f7b:
              ffpmsg(pcVar8);
              *status = 0x19d;
            }
          }
          else if (local_e2 == 0x2020 && local_e6 == 0x454c4954) {
            iVar5 = fits_strncasecmp(local_78,"\'row",4);
            if (iVar5 == 0) {
              local_128[0] = -1;
            }
            else {
              iVar5 = fits_strncasecmp(local_78,"\'whole",6);
              if (iVar5 == 0) {
                local_128[0] = -1;
                local_128[1] = 0xffffffffffffffff;
                local_128[2] = 0xffffffffffffffff;
              }
              else {
                ffdtdm(infptr,local_78,0,6,&local_ec,local_128,status);
              }
            }
            pFVar1 = outfptr->Fptr;
            lVar7 = 0;
            do {
              pFVar1->request_tilesize[lVar7] = local_128[lVar7];
              lVar7 = lVar7 + 1;
            } while (lVar7 != 6);
          }
          else if (local_e2 == 0x4555 && local_e6 == 0x4c415651) {
            dVar3 = atof(local_78);
            fVar9 = (float)dVar3;
            if ((fVar9 != 0.0) || (NAN(fVar9))) {
              outfptr->Fptr->request_quantize_level = fVar9;
            }
            else {
              outfptr->Fptr->request_quantize_level = 9999.0;
            }
          }
          else if (local_e2 == 0x4448 && local_e6 == 0x54454d51) {
            iVar5 = fits_strncasecmp(local_78,"\'no_dither",10);
            if (iVar5 == 0) {
              iVar5 = -1;
            }
            else {
              iVar5 = fits_strncasecmp(local_78,"\'subtractive_dither_1",0x15);
              if (iVar5 == 0) {
                iVar5 = 1;
              }
              else {
                iVar4 = fits_strncasecmp(local_78,"\'subtractive_dither_2",0x15);
                iVar5 = 2;
                if (iVar4 != 0) {
                  pcVar8 = "Unknown value for FZQUANT keyword: (set_compression_pref)";
                  goto LAB_001c5fea;
                }
              }
            }
            outfptr->Fptr->request_quantize_method = iVar5;
          }
          else if (local_e2 == 0x4453 && local_e6 == 0x52485444) {
            iVar5 = fits_strncasecmp(local_78,"\'checksum",9);
            if (iVar5 == 0) {
              iVar5 = -1;
            }
            else {
              iVar5 = fits_strncasecmp(local_78,"\'clock",6);
              if (iVar5 == 0) {
                iVar5 = 0;
              }
              else {
                lVar7 = atol(local_78 + (local_78[0] == '\''));
                iVar5 = (int)lVar7;
                if (iVar5 - 0x2711U < 0xffffd8f0) {
                  pcVar8 = "Invalid value for FZDTHRSD keyword: (set_compression_pref)";
                  goto LAB_001c5fea;
                }
              }
            }
            if (10000 < iVar5) {
              pcVar8 = "illegal dithering seed value (fits_set_dither_seed)";
              goto LAB_001c5f7b;
            }
            outfptr->Fptr->request_dither_seed = iVar5;
          }
          else if (local_e6._2_1_ == 'F' && (short)local_e6 == 0x3249) {
            iVar5 = fits_strcasecmp(local_78,"t");
            if (iVar5 == 0) {
              outfptr->Fptr->request_lossy_int_compress = 1;
            }
            else {
              iVar5 = fits_strcasecmp(local_78,"f");
              if (iVar5 != 0) {
                pcVar8 = "Unknown value for FZI2F keyword: (set_compression_pref)";
LAB_001c5fea:
                ffpmsg(pcVar8);
                ffpmsg(local_78);
                *status = 0x19d;
                return 0x19d;
              }
              outfptr->Fptr->request_lossy_int_compress = 0;
            }
          }
          else if (local_e2 == 0x454c && local_e6 == 0x41435348) {
            dVar3 = atof(local_78);
            outfptr->Fptr->request_hcomp_scale = (float)dVar3;
          }
        }
        bVar2 = iVar6 < local_12c;
        iVar6 = iVar6 + 1;
      } while (bVar2);
    }
    iVar6 = *status;
  }
  return iVar6;
}

Assistant:

int fits_set_compression_pref(
      fitsfile *infptr,
      fitsfile *outfptr,
      int *status) 
{
/*
   Set the preference for various compression options, based
   on keywords in the input file that
   provide guidance about how the HDU should be compressed when written
   to the output file.
*/

    int ii, naxis, nkeys, comptype;
    int  ivalue;
    long tiledim[6]= {1,1,1,1,1,1};
    char card[FLEN_CARD], value[FLEN_VALUE];
    double  qvalue;
    float hscale;
    LONGLONG datastart, dataend; 
    if (*status > 0)
        return(*status);

    /* check the size of the HDU that is to be compressed */
    fits_get_hduaddrll(infptr, NULL, &datastart, &dataend, status);
    if ( (LONGLONG)(dataend - datastart) > UINT32_MAX) {
       /* use 64-bit '1Q' variable length columns instead of '1P' columns */
       /* for large files, in case the heap size becomes larger than 2**32 bytes*/
       fits_set_huge_hdu(outfptr, 1, status);
    }

    fits_get_hdrspace(infptr, &nkeys, NULL, status);
 
   /* look for a image compression directive keywords (begin with 'FZ') */
    for (ii = 2; ii <= nkeys; ii++) {
        
	fits_read_record(infptr, ii, card, status);

	if (!strncmp(card, "FZ", 2) ){
	
            /* get the keyword value string */
            fits_parse_value(card, value, NULL, status);
	    
	    if      (!strncmp(card+2, "ALGOR", 5) ) {

	        /* set the desired compression algorithm */
                /* allowed values: RICE_1, GZIP_1, GZIP_2, PLIO_1,     */
                /*  HCOMPRESS_1, BZIP2_1, and NOCOMPRESS               */

                if        (!fits_strncasecmp(value, "'RICE_1", 7) ) {
		    comptype = RICE_1;
                } else if (!fits_strncasecmp(value, "'GZIP_1", 7) ) {
		    comptype = GZIP_1;
                } else if (!fits_strncasecmp(value, "'GZIP_2", 7) ) {
		    comptype = GZIP_2;
                } else if (!fits_strncasecmp(value, "'PLIO_1", 7) ) {
		    comptype = PLIO_1;
                } else if (!fits_strncasecmp(value, "'HCOMPRESS_1", 12) ) {
		    comptype = HCOMPRESS_1;
                } else if (!fits_strncasecmp(value, "'NONE", 5) ) {
		    comptype = NOCOMPRESS;
		} else {
			ffpmsg("Unknown FZALGOR keyword compression algorithm:");
			ffpmsg(value);
			return(*status = DATA_COMPRESSION_ERR);
		}  

	        fits_set_compression_type (outfptr, comptype, status);

	    } else if (!strncmp(card+2, "TILE  ", 6) ) {

                if (!fits_strncasecmp(value, "'row", 4) ) {
                   tiledim[0] = -1;
		} else if (!fits_strncasecmp(value, "'whole", 6) ) {
                   tiledim[0] = -1;
                   tiledim[1] = -1;
                   tiledim[2] = -1;
                } else {
		   ffdtdm(infptr, value, 0,6, &naxis, tiledim, status);
                }

	        /* set the desired tile size */
		fits_set_tile_dim (outfptr, 6, tiledim, status);

	    } else if (!strncmp(card+2, "QVALUE", 6) ) {

	        /* set the desired Q quantization value */
		qvalue = atof(value);
		fits_set_quantize_level (outfptr, (float) qvalue, status);

	    } else if (!strncmp(card+2, "QMETHD", 6) ) {

                    if (!fits_strncasecmp(value, "'no_dither", 10) ) {
                        ivalue = -1; /* just quantize, with no dithering */
		    } else if (!fits_strncasecmp(value, "'subtractive_dither_1", 21) ) {
                        ivalue = SUBTRACTIVE_DITHER_1; /* use subtractive dithering */
		    } else if (!fits_strncasecmp(value, "'subtractive_dither_2", 21) ) {
                        ivalue = SUBTRACTIVE_DITHER_2; /* dither, except preserve zero-valued pixels */
		    } else {
		        ffpmsg("Unknown value for FZQUANT keyword: (set_compression_pref)");
			ffpmsg(value);
                        return(*status = DATA_COMPRESSION_ERR);
		    }

		    fits_set_quantize_method(outfptr, ivalue, status);
		    
	    } else if (!strncmp(card+2, "DTHRSD", 6) ) {

                if (!fits_strncasecmp(value, "'checksum", 9) ) {
                    ivalue = -1; /* use checksum of first tile */
		} else if (!fits_strncasecmp(value, "'clock", 6) ) {
                    ivalue = 0; /* set dithering seed based on system clock */
		} else {  /* read integer value */
		    if (*value == '\'')
                        ivalue = (int) atol(value+1); /* allow for leading quote character */
                    else 
                        ivalue = (int) atol(value); 

                    if (ivalue < 1 || ivalue > 10000) {
		        ffpmsg("Invalid value for FZDTHRSD keyword: (set_compression_pref)");
			ffpmsg(value);
                        return(*status = DATA_COMPRESSION_ERR);
                    }
		}

	        /* set the desired dithering */
		fits_set_dither_seed(outfptr, ivalue, status);

	    } else if (!strncmp(card+2, "I2F", 3) ) {

	        /* set whether to convert integers to float then use lossy compression */
                if (!fits_strcasecmp(value, "t") ) {
		    fits_set_lossy_int (outfptr, 1, status);
		} else if (!fits_strcasecmp(value, "f") ) {
		    fits_set_lossy_int (outfptr, 0, status);
		} else {
		        ffpmsg("Unknown value for FZI2F keyword: (set_compression_pref)");
			ffpmsg(value);
                        return(*status = DATA_COMPRESSION_ERR);
                }

	    } else if (!strncmp(card+2, "HSCALE ", 6) ) {

	        /* set the desired Hcompress scale value */
		hscale = (float) atof(value);
		fits_set_hcomp_scale (outfptr, hscale, status);
            }
	}    
    }
    return(*status);
}